

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O2

int Llb_ManGroupHasVar(Llb_Man_t *p,int iGroup,int iVar)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  
  pvVar1 = Vec_PtrEntry(p->vGroups,iGroup);
  iVar3 = 0;
  while (iVar3 < (*(Vec_Ptr_t **)((long)pvVar1 + 8))->nSize) {
    pvVar2 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar1 + 8),iVar3);
    iVar3 = iVar3 + 1;
    if (*(int *)((long)pvVar2 + 0x24) == iVar) {
      return 1;
    }
  }
  iVar3 = 0;
  do {
    if ((*(Vec_Ptr_t **)((long)pvVar1 + 0x10))->nSize <= iVar3) {
      return 0;
    }
    pvVar2 = Vec_PtrEntry(*(Vec_Ptr_t **)((long)pvVar1 + 0x10),iVar3);
    iVar3 = iVar3 + 1;
  } while (*(int *)((long)pvVar2 + 0x24) != iVar);
  return 1;
}

Assistant:

int Llb_ManGroupHasVar( Llb_Man_t * p, int iGroup, int iVar )
{
    Llb_Grp_t * pGroup = (Llb_Grp_t *)Vec_PtrEntry( p->vGroups, iGroup );
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        if ( pObj->Id == iVar )
            return 1;
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        if ( pObj->Id == iVar )
            return 1;
    return 0;
}